

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O2

void __thiscall b_tree_node::_split_child(b_tree_node *this,int i,int64_t ofs)

{
  ushort uVar1;
  ushort *puVar2;
  int64_t *piVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  b_tree_node original_node;
  b_tree_node new_node;
  b_tree_node bStack_e8;
  b_tree_node local_80;
  
  b_tree_node(&bStack_e8,this->_p,ofs);
  b_tree_node(&local_80,this->_p,*bStack_e8._min_degree_field,*bStack_e8._leaf_field != 0);
  puVar2 = this->_min_degree_field;
  *local_80._num_keys_field = *puVar2 - 1;
  uVar6 = (ulong)*puVar2;
  for (lVar4 = 0; lVar4 < (long)(uVar6 - 1); lVar4 = lVar4 + 1) {
    local_80._keys_field[lVar4] = bStack_e8._keys_field[lVar4 + uVar6];
    local_80._valid_keys_field[lVar4] = bStack_e8._valid_keys_field[lVar4 + uVar6];
    uVar6 = (ulong)*this->_min_degree_field;
    local_80._vals_field[lVar4] = bStack_e8._vals_field[uVar6 + lVar4];
  }
  if (*bStack_e8._leaf_field == 0) {
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      local_80._child_ofs_field[uVar5] =
           *(int64_t *)
            ((long)bStack_e8._child_ofs_field + uVar5 * 8 + (ulong)(uint)((int)uVar6 * 8));
    }
  }
  *bStack_e8._num_keys_field = (short)uVar6 - 1;
  piVar3 = this->_child_ofs_field;
  lVar4 = (long)i;
  uVar5 = (ulong)*this->_num_keys_field;
  for (uVar6 = uVar5; lVar4 < (long)uVar6; uVar6 = uVar6 - 1) {
    piVar3[uVar6 + 1] = piVar3[uVar6];
  }
  piVar3[lVar4 + 1] = local_80._ofs_field;
  for (; lVar4 < (long)uVar5; uVar5 = uVar5 - 1) {
    this->_keys_field[uVar5] = this->_keys_field[uVar5 - 1];
    this->_valid_keys_field[uVar5] = this->_valid_keys_field[uVar5 - 1];
    this->_vals_field[uVar5] = this->_vals_field[uVar5 - 1];
  }
  uVar1 = *this->_min_degree_field;
  this->_keys_field[lVar4] = bStack_e8._keys_field[(ulong)uVar1 - 1];
  this->_valid_keys_field[lVar4] = bStack_e8._valid_keys_field[(ulong)uVar1 - 1];
  this->_vals_field[lVar4] = bStack_e8._vals_field[(ulong)*this->_min_degree_field - 1];
  *this->_num_keys_field = *this->_num_keys_field + 1;
  r_memory_map::~r_memory_map(&local_80._mm);
  r_memory_map::~r_memory_map(&bStack_e8._mm);
  return;
}

Assistant:

void b_tree_node::_split_child(int i, int64_t ofs)
{
    b_tree_node original_node(_p, ofs);

    // Create a new node which is going to store (t-1) keys
    // of original_node
    b_tree_node new_node(_p, original_node._min_degree(), original_node._leaf());
    new_node._set_num_keys(_min_degree() - 1);
 
    // Copy the last (min_degree-1) keys of original_node to new_node
    for (int j = 0; j < _min_degree()-1; j++)
    {
        new_node._keys_field[j] = original_node._keys_field[j+_min_degree()];
        new_node._valid_keys_field[j] = original_node._valid_keys_field[j+_min_degree()];
        new_node._vals_field[j] = original_node._vals_field[j+_min_degree()];
    }
 
    // Copy the last min_degree children of original_node to new_node
    if (original_node._leaf() == false)
    {
        for (int j = 0; j < _min_degree(); j++)
            new_node._child_ofs_field[j] = original_node._child_ofs_field[j+_min_degree()];
    }
 
    // Reduce the number of keys in original_node
    original_node._set_num_keys(_min_degree() - 1);
 
    // Since this node is going to have a new child,
    // create space of new child
    for (int j = _num_keys(); j >= i+1; j--)
        _child_ofs_field[j+1] = _child_ofs_field[j];
 
    // Link the new child to this node
    _child_ofs_field[i+1] = new_node._ofs();
 
    // A key of original_node will move to this node. Find the location of
    // new key and move all greater keys one space ahead
    for (int j = _num_keys()-1; j >= i; j--)
    {
        _keys_field[j+1] = _keys_field[j];
        _valid_keys_field[j+1] = _valid_keys_field[j];
        _vals_field[j+1] = _vals_field[j];
    }
 
    // Copy the middle key of original_node to this node
    _keys_field[i] = original_node._keys_field[_min_degree()-1];
    _valid_keys_field[i] = original_node._valid_keys_field[_min_degree()-1];
    _vals_field[i] = original_node._vals_field[_min_degree()-1];
 
    // Increment count of keys in this node
    _set_num_keys(_num_keys() + 1);
}